

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAddiEa<(moira::Instr)120,(moira::Mode)3,(moira::Size)2>(Moira *this,u16 opcode)

{
  ushort uVar1;
  bool bVar2;
  u32 uVar3;
  ulong in_RAX;
  ulong uVar4;
  u32 data;
  u32 ea;
  undefined8 local_28;
  
  uVar1 = (this->queue).irc;
  local_28 = in_RAX;
  readExt(this);
  bVar2 = readOp<(moira::Mode)3,(moira::Size)2,0ul>
                    (this,opcode & 7,(u32 *)((long)&local_28 + 4),(u32 *)&local_28);
  if (bVar2) {
    uVar4 = (local_28 & 0xffffffff) - (ulong)uVar1;
    bVar2 = (bool)((byte)(uVar4 >> 0x10) & 1);
    (this->reg).sr.c = bVar2;
    (this->reg).sr.x = bVar2;
    (this->reg).sr.v =
         (bool)((byte)((((uint)uVar4 ^ (uint)local_28) & (uVar1 ^ (uint)local_28)) >> 0xf) & 1);
    (this->reg).sr.z = (short)uVar4 == 0;
    (this->reg).sr.n = (bool)((byte)(uVar4 >> 0xf) & 1);
    uVar3 = (this->reg).pc;
    (this->reg).pc0 = uVar3;
    (this->queue).ird = (this->queue).irc;
    uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar3 + 2);
    (this->queue).irc = (u16)uVar3;
    writeM<(moira::MemSpace)1,(moira::Size)2,4ul>(this,local_28._4_4_,(uint)uVar4);
  }
  return;
}

Assistant:

void
Moira::execAddiEa(u16 opcode)
{
    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    u32 ea, data, result;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    result = addsub<I,S>(src, data);
    prefetch();

    writeOp<M,S, POLLIPL>(dst, ea, result);
}